

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall pugi::xml_node::insert_move_after(xml_node *this,xml_node *moved,xml_node *node)

{
  ulong *puVar1;
  xml_node child;
  xml_node_struct *pxVar2;
  bool bVar3;
  xml_node xVar4;
  
  xVar4 = (xml_node)this->_root;
  child = (xml_node)moved->_root;
  bVar3 = impl::anon_unknown_0::allow_move(xVar4,child);
  if (((bVar3) && (pxVar2 = node->_root, pxVar2 != (xml_node_struct *)0x0)) &&
     (child._root != pxVar2 && pxVar2->parent == xVar4._root)) {
    puVar1 = (ulong *)(*(long *)((long)xVar4._root - ((xVar4._root)->header >> 8)) + -0x40);
    *puVar1 = *puVar1 | 0x40;
    impl::anon_unknown_0::remove_node(child._root);
    impl::anon_unknown_0::insert_node_after(moved->_root,node->_root);
    xVar4 = (xml_node)moved->_root;
  }
  else {
    xVar4._root = (xml_node_struct *)0x0;
  }
  return (xml_node)xVar4._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::insert_move_after(const xml_node& moved, const xml_node& node)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();
		if (moved._root == node._root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		// disable document_buffer_order optimization since moving nodes around changes document order without changing buffer pointers
		impl::get_document(_root).header |= impl::xml_memory_page_contents_shared_mask;

		impl::remove_node(moved._root);
		impl::insert_node_after(moved._root, node._root);

		return moved;
	}